

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O0

long bhf::ads::AddRemoteRoute
               (string *remote,AmsNetId destNetId,string *destAddr,string *routeName,
               string *remoteUsername,string *remotePassword)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  ostream *poVar9;
  void *pvVar10;
  uint32_t serviceId;
  string *local_758;
  string local_738 [32];
  stringstream local_718 [8];
  stringstream stream_3;
  ostream local_708 [376];
  string local_590 [32];
  stringstream local_570 [8];
  stringstream stream_2;
  ostream local_560 [376];
  string local_3e8 [32];
  stringstream local_3c8 [8];
  stringstream stream_1;
  ostream local_3b8 [376];
  unsigned_short local_240;
  unsigned_short local_23e;
  uint local_23c;
  uint16_t len;
  uint16_t tag;
  uint count;
  stringstream local_218 [8];
  stringstream stream;
  ostream local_208 [380];
  undefined4 local_8c;
  ulong local_88;
  long status;
  AmsAddr myAddr;
  undefined1 local_60 [4];
  uint32_t tagCount;
  Frame f;
  string *remotePassword_local;
  string *remoteUsername_local;
  string *routeName_local;
  string *destAddr_local;
  string *remote_local;
  ulong uStack_10;
  AmsNetId destNetId_local;
  
  remote_local._2_4_ = destNetId.b._0_4_;
  remote_local._6_2_ = destNetId.b._4_2_;
  f.m_OriginalSize = (size_t)remotePassword;
  Frame::Frame((Frame *)local_60,0x100,(void *)0x0);
  bVar1 = PrependUdpTag((Frame *)local_60,destAddr,5);
  bVar2 = PrependUdpTag((Frame *)local_60,(string *)f.m_OriginalSize,2);
  bVar3 = PrependUdpTag((Frame *)local_60,remoteUsername,0xd);
  bVar4 = PrependUdpTag((Frame *)local_60,(AmsNetId *)((long)&remote_local + 2),7);
  uVar7 = std::__cxx11::string::empty();
  local_758 = destAddr;
  if ((uVar7 & 1) == 0) {
    local_758 = routeName;
  }
  bVar5 = PrependUdpTag((Frame *)local_60,local_758,0xc);
  serviceId = (uint32_t)bVar5;
  myAddr.netId.b._0_4_ =
       htole<unsigned_int>((uint)bVar4 + (uint)bVar1 + (uint)bVar2 + (uint)bVar3 + serviceId);
  Frame::prepend<unsigned_int>((Frame *)local_60,(uint *)&myAddr);
  status._4_2_ = remote_local._6_2_;
  status._0_4_ = remote_local._2_4_;
  status._6_2_ = 0;
  Frame::prepend((Frame *)local_60,&status,8);
  local_88 = SendRecv((ads *)remote,(string *)local_60,(Frame *)0x6,serviceId);
  uStack_10 = local_88;
  if (local_88 == 0) {
    sVar8 = Frame::capacity((Frame *)local_60);
    if (sVar8 < 0xc) {
      std::__cxx11::stringstream::stringstream(local_218);
      poVar9 = std::operator<<(local_208,"AddRemoteRoute");
      poVar9 = std::operator<<(poVar9,"(): frame too short to be AMS response \'0x");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,std::hex);
      sVar8 = Frame::capacity((Frame *)local_60);
      poVar9 = (ostream *)std::ostream::operator<<(pvVar10,sVar8);
      std::operator<<(poVar9,"\'\n");
      std::__cxx11::stringstream::str();
      Logger::Log(3,(string *)&len);
      std::__cxx11::string::~string((string *)&len);
      std::__cxx11::stringstream::~stringstream(local_218);
      uStack_10 = 0x705;
    }
    else {
      Frame::remove((Frame *)local_60,(char *)0x8);
      local_23c = Frame::pop_letoh<unsigned_int>((Frame *)local_60);
      while (local_23c != 0) {
        local_23c = local_23c - 1;
        sVar8 = Frame::capacity((Frame *)local_60);
        if (sVar8 < 4) {
          std::__cxx11::stringstream::stringstream(local_3c8);
          poVar9 = std::operator<<(local_3b8,"AddRemoteRoute");
          poVar9 = std::operator<<(poVar9,"(): frame too short to be AMS response \'0x");
          pvVar10 = (void *)std::ostream::operator<<(poVar9,std::hex);
          sVar8 = Frame::capacity((Frame *)local_60);
          poVar9 = (ostream *)std::ostream::operator<<(pvVar10,sVar8);
          std::operator<<(poVar9,"\'\n");
          std::__cxx11::stringstream::str();
          Logger::Log(3,local_3e8);
          std::__cxx11::string::~string((string *)local_3e8);
          std::__cxx11::stringstream::~stringstream(local_3c8);
          uStack_10 = 0x705;
          goto LAB_00171b13;
        }
        local_23e = Frame::pop_letoh<unsigned_short>((Frame *)local_60);
        local_240 = Frame::pop_letoh<unsigned_short>((Frame *)local_60);
        if (local_23e == 1) {
          if (local_240 == 4) {
            uVar6 = Frame::pop_letoh<unsigned_int>((Frame *)local_60);
            uStack_10 = (ulong)uVar6;
          }
          else {
            std::__cxx11::stringstream::stringstream(local_718);
            poVar9 = std::operator<<(local_708,"AddRemoteRoute");
            poVar9 = std::operator<<(poVar9,"(): response contains invalid tag length \'");
            pvVar10 = (void *)std::ostream::operator<<(poVar9,std::hex);
            poVar9 = (ostream *)std::ostream::operator<<(pvVar10,local_240);
            std::operator<<(poVar9,"\'\n");
            std::__cxx11::stringstream::str();
            Logger::Log(3,local_738);
            std::__cxx11::string::~string((string *)local_738);
            std::__cxx11::stringstream::~stringstream(local_718);
            uStack_10 = 0x705;
          }
          goto LAB_00171b13;
        }
        std::__cxx11::stringstream::stringstream(local_570);
        poVar9 = std::operator<<(local_560,"AddRemoteRoute");
        poVar9 = std::operator<<(poVar9,"(): response contains tagId \'0x");
        pvVar10 = (void *)std::ostream::operator<<(poVar9,std::hex);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar10,local_23e);
        std::operator<<(poVar9,"\' -> ignoring\n");
        std::__cxx11::stringstream::str();
        Logger::Log(2,local_590);
        std::__cxx11::string::~string((string *)local_590);
        std::__cxx11::stringstream::~stringstream(local_570);
        Frame::remove((Frame *)local_60,(char *)(ulong)local_240);
      }
      uStack_10 = 0x706;
      local_23c = local_23c - 1;
    }
  }
LAB_00171b13:
  local_8c = 1;
  Frame::~Frame((Frame *)local_60);
  return uStack_10;
}

Assistant:

long AddRemoteRoute(const std::string& remote,
                    AmsNetId           destNetId,
                    const std::string& destAddr,
                    const std::string& routeName,
                    const std::string& remoteUsername,
                    const std::string& remotePassword)
{
    Frame f { 256 };
    uint32_t tagCount = 0;
    tagCount += PrependUdpTag(f, destAddr, UdpTag::COMPUTERNAME);
    tagCount += PrependUdpTag(f, remotePassword, UdpTag::PASSWORD);
    tagCount += PrependUdpTag(f, remoteUsername, UdpTag::USERNAME);
    tagCount += PrependUdpTag(f, destNetId, UdpTag::NETID);
    tagCount += PrependUdpTag(f, routeName.empty() ? destAddr : routeName, UdpTag::ROUTENAME);
    f.prepend(htole(tagCount));

    const auto myAddr = AmsAddr { destNetId, 0 };
    f.prepend(&myAddr, sizeof(myAddr));

    const auto status = SendRecv(remote, f, UdpServiceId::ADDROUTE);
    if (status) {
        return status;
    }

    // We expect at least the AmsAddr and count fields
    if (sizeof(AmsAddr) + sizeof(uint32_t) > f.capacity()) {
        LOG_ERROR(__FUNCTION__ << "(): frame too short to be AMS response '0x" << std::hex << f.capacity() << "'\n");
        return ADSERR_DEVICE_INVALIDSIZE;
    }

    // ignore AmsAddr in response
    f.remove(sizeof(AmsAddr));

    // process UDP discovery tags
    auto count = f.pop_letoh<uint32_t>();
    while (count--) {
        uint16_t tag;
        uint16_t len;
        if (sizeof(tag) + sizeof(len) > f.capacity()) {
            LOG_ERROR(__FUNCTION__ << "(): frame too short to be AMS response '0x" << std::hex << f.capacity() <<
                      "'\n");
            return ADSERR_DEVICE_INVALIDSIZE;
        }

        tag = f.pop_letoh<uint16_t>();
        len = f.pop_letoh<uint16_t>();
        if (1 != tag) {
            LOG_WARN(__FUNCTION__ << "(): response contains tagId '0x" << std::hex << tag << "' -> ignoring\n");
            f.remove(len);
            continue;
        }
        if (sizeof(uint32_t) != len) {
            LOG_ERROR(__FUNCTION__ << "(): response contains invalid tag length '" << std::hex << len << "'\n");
            return ADSERR_DEVICE_INVALIDSIZE;
        }
        return f.pop_letoh<uint32_t>();
    }
    return ADSERR_DEVICE_INVALIDDATA;
}